

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O3

void __thiscall diy::FileStorage::get(FileStorage *this,int i,void *x,Load *load)

{
  int __fd;
  FileBuffer fb;
  FileRecord fr;
  void *local_70;
  BinaryBuffer local_68;
  FILE *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  FileRecord local_48;
  
  extract_file_record(&local_48,this,i);
  __fd = open(local_48.name._M_dataplus._M_p,0,0x180);
  local_60 = fdopen(__fd,"r");
  local_68._vptr_BinaryBuffer = (_func_int **)&PTR__BinaryBuffer_00149380;
  local_58 = 0;
  uStack_50 = 0;
  local_70 = x;
  if ((load->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*load->_M_invoker)((_Any_data *)load,&local_70,&local_68);
    fclose(local_60);
    remove_file(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.name._M_dataplus._M_p != &local_48.name.field_2) {
      operator_delete(local_48.name._M_dataplus._M_p,local_48.name.field_2._M_allocated_capacity + 1
                     );
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void   get(int i, void* x, detail::Load load) override
      {
        FileRecord fr = extract_file_record(i);

        //int fh = open(fr.name.c_str(), O_RDONLY | O_SYNC, 0600);
#if defined(_WIN32)
        int fh = -1;
        _sopen_s(&fh, fr.name.c_str(), _O_RDONLY | _O_BINARY, _SH_DENYNO, _S_IREAD);
        detail::FileBuffer fb(_fdopen(fh, "rb"));
#else
        int fh = open(fr.name.c_str(), O_RDONLY, 0600);
        detail::FileBuffer fb(fdopen(fh, "r"));
#endif
        load(x, fb);
        fclose(fb.file);

        remove_file(fr);
      }